

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk.cc
# Opt level: O1

base_learner * topk_setup(options_i *options,vw *all)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  topk *dat;
  base_learner *l;
  single_learner *base;
  learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar3;
  size_type __dnew;
  option_group_definition new_options;
  long local_210;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  option_group_definition local_1e8;
  string local_1b0;
  undefined4 *local_190;
  undefined8 local_188;
  undefined4 local_180;
  undefined2 local_17c;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<unsigned_int> local_d0;
  
  dat = calloc_or_throw<topk>(1);
  *(undefined8 *)dat = 0;
  (dat->pr_queue).c.
  super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (dat->pr_queue).c.
  super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (dat->pr_queue).c.
  super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(dat->pr_queue).field_0x18 = 0;
  dat->all = (vw *)0x0;
  local_17c = 0x4b;
  local_180 = 0x20706f54;
  local_188 = 5;
  paVar1 = &local_1e8.m_name.field_2;
  local_1e8.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1e8,&local_180,(long)&local_17c + 1);
  local_1e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  local_1b0.field_2._M_allocated_capacity._0_4_ = 0x706f74;
  local_1b0._M_string_length = 3;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_170,&local_1b0,&dat->K);
  local_100 = true;
  local_210 = 0x14;
  local_208 = local_1f8;
  local_208 = (long *)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_210);
  local_1f8[0] = local_210;
  *local_208 = 0x6572206b20706f74;
  local_208[1] = 0x61646e656d6d6f63;
  *(undefined4 *)(local_208 + 2) = 0x6e6f6974;
  local_200 = local_210;
  *(char *)((long)local_208 + local_210) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_170);
  VW::config::option_group_definition::add<unsigned_int>(&local_1e8,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf610;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_208 != local_1f8) {
    operator_delete(local_208);
  }
  local_170._0_8_ = &PTR__typed_option_002cf610;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1e8);
  local_170._16_4_ = 0x706f74;
  local_170._8_8_ = (pointer)0x3;
  local_170._0_8_ = local_170 + 0x10;
  iVar2 = (*options->_vptr_options_i[1])(options,local_170);
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar2 == '\0') {
    plVar3 = (learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
  }
  else {
    dat->all = all;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar3 = LEARNER::learner<topk,std::vector<example*,std::allocator<example*>>>::
             init_learner<LEARNER::learner<char,example>>
                       (dat,base,predict_or_learn<true>,predict_or_learn<false>,1,
                        *(prediction_type_t *)(base + 0xd0));
    *(undefined8 *)(plVar3 + 0x58) = *(undefined8 *)(plVar3 + 0x18);
    *(code **)(plVar3 + 0x68) = finish_example;
    *(undefined8 *)(plVar3 + 0xb8) = *(undefined8 *)(plVar3 + 0x18);
    *(undefined8 *)(plVar3 + 0xc0) = *(undefined8 *)(plVar3 + 0x20);
    *(code **)(plVar3 + 200) = finish;
    dat = (topk *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1e8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8.m_name._M_dataplus._M_p);
  }
  if (dat != (topk *)0x0) {
    destroy_free<topk>(dat);
  }
  return (base_learner *)plVar3;
}

Assistant:

LEARNER::base_learner* topk_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<topk>();

  option_group_definition new_options("Top K");
  new_options.add(make_option("top", data->K).keep().help("top k recommendation"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("top"))
    return nullptr;

  data->all = &all;

  LEARNER::learner<topk, multi_ex>& l =
      init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}